

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint obmc_check_better_fast
               (MV *this_mv,MV *best_mv,SubpelMvLimits *mv_limits,
               SUBPEL_SEARCH_VAR_PARAMS *var_params,MV_COST_PARAMS *mv_cost_params,uint *besterr,
               uint *sse1,int *distortion,int *has_better_mv)

{
  MV mv;
  buf_2d *pbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint local_38;
  MV local_34;
  
  mv = *this_mv;
  iVar2 = av1_is_subpelmv_in_range(mv_limits,mv);
  if (iVar2 == 0) {
    uVar5 = 0x7fffffff;
  }
  else {
    pbVar1 = (var_params->ms_buffers).ref;
    iVar2 = pbVar1->stride;
    uVar3 = (*var_params->vfp->osvf)
                      (pbVar1->buf + (((int)mv >> 0x13) + ((int)mv.row >> 3) * iVar2),iVar2,
                       (uint)mv >> 0x10 & 7,(uint)mv & 7,(var_params->ms_buffers).wsrc,
                       (var_params->ms_buffers).obmc_mask,&local_38);
    iVar2 = mv_cost_params->error_per_bit;
    iVar4 = 0;
    auVar6 = psllw(ZEXT416(CONCAT22((*this_mv).col - (*mv_cost_params->ref_mv).col,
                                    (*this_mv).row - (*mv_cost_params->ref_mv).row)),3);
    local_34 = auVar6._0_4_;
    if (mv_cost_params->mv_cost_type == '\0') {
      iVar4 = mv_cost(&local_34,mv_cost_params->mvjcost,mv_cost_params->mvcost);
      iVar4 = iVar4 * iVar2 + 0x1000 >> 0xd;
    }
    uVar5 = iVar4 + uVar3;
    if (uVar5 < *besterr) {
      *besterr = uVar5;
      *best_mv = *this_mv;
      *distortion = uVar3;
      *sse1 = local_38;
      *(byte *)has_better_mv = (byte)*has_better_mv | 1;
    }
  }
  return uVar5;
}

Assistant:

static inline unsigned int obmc_check_better_fast(
    const MV *this_mv, MV *best_mv, const SubpelMvLimits *mv_limits,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    const int thismse = estimate_obmc_pref_error(this_mv, var_params, &sse);

    cost = estimate_obmc_mvcost(this_mv, mv_cost_params);
    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}